

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_776f::TENSOR_INITIALIZING_2_Test::TestBody(TENSOR_INITIALIZING_2_Test *this)

{
  int *piVar1;
  long lVar2;
  char *pcVar3;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_01;
  AssertHelper local_a8;
  undefined4 local_a0;
  array<unsigned_int,_2UL> local_98;
  undefined4 local_90;
  allocator_type local_8b;
  allocator_type local_8a;
  allocator_type local_89;
  AssertionResult gtest_ar;
  vector<int,_std::allocator<int>_> local_70;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_58;
  tensor<int,_2U> ts;
  
  local_98._M_elems[0] = 1;
  local_98._M_elems[1] = 2;
  local_90 = 3;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar,__l,&local_89);
  local_a8.data_ = (AssertHelperData *)0x500000004;
  local_a0 = 6;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_70,__l_00,&local_8a);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&gtest_ar;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_58,__l_01,&local_8b);
  dnet::data_types::tensor<int,_2U>::tensor(&ts,&local_58,(array<unsigned_int,_2UL>)0x300000002);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_58);
  lVar2 = 0x18;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)(&gtest_ar.success_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  local_98._M_elems[0] = 0;
  local_98._M_elems[1] = 0;
  piVar1 = dnet::data_types::tensor<int,_2U>::operator[](&ts,&local_98);
  local_a8.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(ts[{0,0}])","1",piVar1,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_98);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_98._M_elems[0] = 0;
  local_98._M_elems[1] = 2;
  piVar1 = dnet::data_types::tensor<int,_2U>::operator[](&ts,&local_98);
  local_a8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(ts[{0,2}])","3",piVar1,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x5e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_98);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_98._M_elems[0] = 1;
  local_98._M_elems[1] = 1;
  piVar1 = dnet::data_types::tensor<int,_2U>::operator[](&ts,&local_98);
  local_a8.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"(ts[{1,1}])","5",piVar1,(int *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/data_types/tensor_test.cc"
               ,0x5f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_98);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&ts);
  return;
}

Assistant:

TEST(TENSOR, INITIALIZING_2) {
        tensor<int, 2> ts({
                                  {1,2,3},
                                  {4,5,6}
                          }, {2,3});
        EXPECT_EQ((ts[{0,0}]), 1);
        EXPECT_EQ((ts[{0,2}]), 3);
        EXPECT_EQ((ts[{1,1}]), 5);
    }